

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

double units::detail::convertFlaggedUnits<units::unit,units::precise_unit>
                 (double val,unit *start,precise_unit *result,double basis)

{
  float fVar1;
  double dVar2;
  unit_data uVar3;
  bool bVar4;
  double dVar5;
  unit uStack_18;
  
  uVar3 = start->base_units_;
  if ((((uint)uVar3 & 0x4fffffff) == 0x40010000) ||
     (((uint)result->base_units_ & 0x4fffffff) == 0x40010000)) {
    if (((uint)start->base_units_ & 0x4fffffff) == 0x40010000) {
      uStack_18 = *start;
      bVar4 = unit::operator==((unit *)&degF,&uStack_18);
      if (bVar4) {
        val = ((val + -32.0) * 5.0) / 9.0;
      }
      else {
        fVar1 = start->multiplier_;
        if ((fVar1 != 1.0) || (NAN(fVar1))) {
          if ((29.5 <= fVar1) || (fVar1 < 0.0)) {
            val = val * (double)fVar1;
          }
          else {
            val = val * (double)fVar1 +
                  convertTemperature<units::unit,_units::precise_unit>::biasTable._M_elems
                  [(int)fVar1];
          }
        }
      }
      dVar5 = val + 273.15;
    }
    else {
      dVar5 = val * (double)start->multiplier_;
    }
    if (((uint)result->base_units_ & 0x4fffffff) == 0x40010000) {
      dVar5 = dVar5 + -273.15;
      uStack_18.base_units_ = result->base_units_;
      uStack_18.multiplier_ = (float)result->multiplier_;
      bVar4 = unit::operator==((unit *)&degF,&uStack_18);
      if (bVar4) {
        dVar5 = dVar5 * 1.8 + 32.0;
      }
      else {
        dVar2 = result->multiplier_;
        if ((dVar2 != 1.0) || (NAN(dVar2))) {
          if ((dVar2 < 29.5) && (0.0 <= dVar2)) {
            dVar5 = dVar5 - convertTemperature<units::unit,_units::precise_unit>::biasTable._M_elems
                            [(int)dVar2];
          }
          dVar5 = dVar5 / dVar2;
        }
      }
    }
    else {
      dVar5 = dVar5 / result->multiplier_;
    }
    return dVar5;
  }
  if (((uint)uVar3 & 0xfffffff) != 0x1ef) {
    return NAN;
  }
  if ((((uint)result->base_units_ ^ (uint)uVar3) >> 0x1e & 1) == 0) {
    fVar1 = start->multiplier_;
  }
  else {
    if (((uint)uVar3 >> 0x1e & 1) == 0) {
      if (NAN(basis)) {
        return (val * (double)start->multiplier_ + -101325.0) / result->multiplier_;
      }
      return ((double)start->multiplier_ * val) / result->multiplier_ - basis;
    }
    if (NAN(basis)) {
      return (val * (double)start->multiplier_ + 101325.0) / result->multiplier_;
    }
    fVar1 = start->multiplier_;
    val = val + basis;
  }
  return ((double)fVar1 * val) / result->multiplier_;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }